

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool absl::debugging_internal::ParseTemplateArgs(State *state)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  
  iVar1 = state->recursion_depth;
  iVar2 = state->steps;
  state->recursion_depth = iVar1 + 1;
  state->steps = iVar2 + 1;
  if (iVar2 < 0x20000 && iVar1 < 0x100) {
    iVar1 = (state->parse_state).prev_name_idx;
    iVar2 = (state->parse_state).mangled_idx;
    iVar4 = (state->parse_state).out_cur_idx;
    uVar3 = *(uint *)&(state->parse_state).field_0xc;
    *(uint *)&(state->parse_state).field_0xc = uVar3 & 0x7fffffff;
    bVar5 = ParseOneCharToken(state,'I');
    if (bVar5) {
      bVar5 = ParseTemplateArg(state);
      if (bVar5) {
        do {
          bVar6 = ParseTemplateArg(state);
        } while (bVar6);
        if (bVar5) {
          ParseQRequiresClauseExpr(state);
          bVar5 = ParseOneCharToken(state,'E');
          if (bVar5) {
            *(uint *)&(state->parse_state).field_0xc =
                 *(uint *)&(state->parse_state).field_0xc & 0x7fffffff | uVar3 & 0x80000000;
            MaybeAppend(state,"<>");
            bVar5 = true;
            goto LAB_00192881;
          }
        }
      }
    }
    (state->parse_state).prev_name_idx = iVar1;
    (state->parse_state).mangled_idx = iVar2;
    (state->parse_state).out_cur_idx = iVar4;
    *(uint *)&(state->parse_state).field_0xc = uVar3;
  }
  bVar5 = false;
LAB_00192881:
  state->recursion_depth = state->recursion_depth + -1;
  return bVar5;
}

Assistant:

static bool ParseTemplateArgs(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;
  DisableAppend(state);
  if (ParseOneCharToken(state, 'I') && OneOrMore(ParseTemplateArg, state) &&
      Optional(ParseQRequiresClauseExpr(state)) &&
      ParseOneCharToken(state, 'E')) {
    RestoreAppend(state, copy.append);
    MaybeAppend(state, "<>");
    return true;
  }
  state->parse_state = copy;
  return false;
}